

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O2

void xmrig::cryptonight_single_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined8 uVar1;
  uint8_t *l;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  __m128i bx0;
  __m128i bx1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  longlong extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  longlong extraout_XMM0_Qb;
  uint uVar20;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar21 [16];
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  __m128i ax0;
  cryptonight_ctx *input_00;
  longlong lVar28;
  longlong lVar29;
  ulong local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  long lStack_60;
  undefined1 local_48 [16];
  
  uVar15 = extra_iters + 0x40000;
  input_00 = *ctx;
  keccak(input,size,input_00->state);
  cn_explode_scratchpad<false>((__m128i *)input_00,(__m128i *)input_00->memory);
  l = input_00->memory;
  local_a8 = *(ulong *)((long)input_00->state + 0x60);
  lVar28 = *(longlong *)((long)input_00->state + 0x68);
  lVar29 = 0;
  fesetround(0x400);
  auVar19 = *(undefined1 (*) [16])((long)input_00->state + 0x20) ^
            *(undefined1 (*) [16])input_00->state;
  uVar25 = *(ulong *)((long)input_00->state + 0x50) ^ *(ulong *)((long)input_00->state + 0x40);
  uVar26 = *(ulong *)((long)input_00->state + 0x58) ^ *(ulong *)((long)input_00->state + 0x48);
  uVar15 = uVar15 >> 1 & 0xffffffff;
  uVar20 = *(uint *)((long)input_00->state + 0x30) ^ *(uint *)((long)input_00->state + 0x10);
  uVar22 = *(uint *)((long)input_00->state + 0x34) ^ *(uint *)((long)input_00->state + 0x14);
  uVar23 = *(uint *)((long)input_00->state + 0x38) ^ *(uint *)((long)input_00->state + 0x18);
  uVar24 = *(uint *)((long)input_00->state + 0x3c) ^ *(uint *)((long)input_00->state + 0x1c);
  while (bVar18 = uVar15 != 0, uVar15 = uVar15 - 1, bVar18) {
    uVar11 = auVar19._0_8_;
    uVar12 = uVar11 & 0xffff0;
    auVar27 = aesenc(*(undefined1 (*) [16])(l + uVar12),auVar19);
    bx0[1] = (longlong)output;
    bx0[0] = (longlong)input_00;
    bx1[1] = lVar29;
    bx1[0] = lVar28;
    ax0[1] = height;
    ax0[0] = (longlong)local_48;
    local_48 = auVar27;
    cryptonight_monero_tweak((uint64_t *)(l + uVar12),l,uVar12,ax0,bx0,bx1,(__m128i *)extra_iters);
    local_98 = auVar27._0_8_;
    uStack_90 = auVar27._8_8_;
    uVar17 = local_98 & 0xffff0;
    uVar16 = lVar28 << 0x20 ^ local_a8 ^ *(ulong *)(l + uVar17);
    uVar12 = (ulong)(auVar27._0_4_ + (int)lVar28 * 2) | 0x80000001;
    local_a8 = uStack_90 / uVar12 & 0xffffffff | uStack_90 % uVar12 << 0x20;
    uVar1 = *(undefined8 *)(l + uVar17 + 8);
    int_sqrt_v2(local_a8 + local_98);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_98;
    uVar13 = SUB168(auVar3 * auVar4,8);
    uVar10 = SUB168(auVar3 * auVar4,0);
    uVar8 = *(ulong *)(l + (uVar17 ^ 0x10));
    uVar9 = *(ulong *)((long)(l + (uVar17 ^ 0x10)) + 8);
    uVar14 = uVar17 ^ 0x20;
    uVar12 = *(ulong *)(l + uVar14);
    uVar2 = *(ulong *)(l + uVar14 + 8);
    lVar5 = *(long *)((long)(l + (uVar17 ^ 0x30)) + 8);
    lVar6 = *(long *)(l + uVar14);
    lVar7 = *(long *)((long)(l + uVar14) + 8);
    lStack_60 = auVar19._8_8_;
    *(ulong *)(l + (uVar17 ^ 0x10)) = uVar25 + *(long *)(l + (uVar17 ^ 0x30));
    *(ulong *)((long)(l + (uVar17 ^ 0x10)) + 8) = uVar26 + lVar5;
    uVar25 = CONCAT44(uVar22,uVar20);
    uVar26 = CONCAT44(uVar24,uVar23);
    *(ulong *)(l + uVar14) = (uVar13 ^ uVar8) + uVar25;
    *(ulong *)((long)(l + uVar14) + 8) = (uVar10 ^ uVar9) + uVar26;
    *(ulong *)(l + (uVar17 ^ 0x30)) = lVar6 + uVar11;
    *(long *)((long)(l + (uVar17 ^ 0x30)) + 8) = lVar7 + lStack_60;
    auVar21._0_8_ = (uVar13 ^ uVar12) + uVar11;
    auVar21._8_8_ = (uVar10 ^ uVar2) + lStack_60;
    *(undefined1 (*) [16])(l + uVar17) = auVar21;
    auVar19._8_8_ = uVar1;
    auVar19._0_8_ = uVar16;
    auVar19 = auVar19 ^ auVar21;
    local_98._4_4_ = auVar27._4_4_;
    uStack_90._0_4_ = auVar27._8_4_;
    uStack_90._4_4_ = auVar27._12_4_;
    uVar20 = auVar27._0_4_;
    uVar22 = local_98._4_4_;
    uVar23 = (uint)uStack_90;
    uVar24 = uStack_90._4_4_;
    lVar28 = extraout_XMM0_Qa;
    lVar29 = extraout_XMM0_Qb;
  }
  cn_implode_scratchpad<false>((__m128i *)input_00->memory,(__m128i *)input_00);
  keccakf((uint64_t *)input_00,0x18);
  switch(input_00->state[0] & 3) {
  case 0:
    blake256_hash(output,input_00->state,200);
    return;
  case 1:
    groestl(input_00->state,0x640,output);
    return;
  case 2:
    jh_hash(0x100,input_00->state,0x640,output);
    return;
  case 3:
    xmr_skein(input_00->state,output);
    return;
  }
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}